

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

bool QMetaType::canConvert(QMetaType fromType,QMetaType toType)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  __atomic_base<int> _Var4;
  int iVar5;
  __atomic_base<int> _Var6;
  Type *this;
  function<bool_(const_void_*,_void_*)> *pfVar7;
  QMetaTypeModuleHelper **ppQVar8;
  pair<int,_int> k;
  InterfaceType *toType_00;
  anon_struct_8_1_2f67eb89 *this_00;
  long in_FS_OFFSET;
  QMetaType local_48;
  QMetaType local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    do {
      while( true ) {
        uVar3 = 0;
        if ((fromType.d_ptr != (QMetaTypeInterface *)0x0) &&
           (uVar3 = ((fromType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i, uVar3 == 0))
        {
          uVar3 = registerHelper(fromType.d_ptr);
        }
        if (toType.d_ptr == (QMetaTypeInterface *)0x0) {
          bVar2 = false;
          goto LAB_0029232e;
        }
        _Var4._M_i = ((toType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
        if (_Var4._M_i == 0) {
          _Var4._M_i = registerHelper(toType.d_ptr);
        }
        bVar2 = false;
        if (((uVar3 == 0) || (_Var4._M_i == 0)) || (bVar2 = true, uVar3 == _Var4._M_i))
        goto LAB_0029232e;
        _Var6._M_i = _Var4._M_i;
        if (_Var4._M_i < (int)uVar3) {
          _Var6._M_i = uVar3;
        }
        this_00 = &metatypeHelper;
        if (((_Var6._M_i < 0x40) ||
            (((ppQVar8 = &qMetaTypeGuiHelper, _Var6._M_i - 0x1000U < 0x18 ||
              (ppQVar8 = &qMetaTypeWidgetsHelper, _Var6._M_i == 0x2000)) &&
             (this_00 = (anon_struct_8_1_2f67eb89 *)*ppQVar8,
             (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
              *)this_00 !=
             (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
              *)0x0)))) &&
           (iVar5 = (*(*(_func_int ***)this_00)[1])
                              (this_00,0,(ulong)uVar3,0,(ulong)(uint)_Var4._M_i),
           (char)iVar5 != '\0')) goto LAB_0029232e;
        this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
               ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
                             *)this_00);
        k.second = _Var4._M_i;
        k.first = uVar3;
        pfVar7 = QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
                 ::function(this,k);
        if (pfVar7 != (function<bool_(const_void_*,_void_*)> *)0x0) goto LAB_0029232e;
        _Var6._M_i = (__int_type_conflict)
                     QtPrivate::QMetaTypeInterfaceWrapper<QSequentialIterable>::metaType.typeId;
        if ((__atomic_base<int>)
            QtPrivate::QMetaTypeInterfaceWrapper<QSequentialIterable>::metaType.typeId._q_value.
            super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
          _Var6._M_i = registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QSequentialIterable>::
                                       metaType);
        }
        if (_Var4._M_i == _Var6._M_i) break;
        _Var6._M_i = (__int_type_conflict)
                     QtPrivate::QMetaTypeInterfaceWrapper<QAssociativeIterable>::metaType.typeId.
                     _q_value.super___atomic_base<int>._M_i;
        if ((__atomic_base<int>)
            QtPrivate::QMetaTypeInterfaceWrapper<QAssociativeIterable>::metaType.typeId._q_value.
            super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
          _Var6._M_i = registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QAssociativeIterable>::
                                       metaType);
        }
        if (_Var4._M_i != _Var6._M_i) {
          if (_Var4._M_i < 0x1c) {
            if (_Var4._M_i == 8) {
LAB_0029238b:
              toType_00 = &QtPrivate::QMetaTypeInterfaceWrapper<QAssociativeIterable>::metaType;
LAB_00292392:
              bVar1 = canConvert(fromType,(QMetaType)toType_00);
              goto LAB_0029239a;
            }
            if (_Var4._M_i == 9) {
              toType_00 = &QtPrivate::QMetaTypeInterfaceWrapper<QSequentialIterable>::metaType;
              goto LAB_00292392;
            }
          }
          else {
            if (_Var4._M_i == 0x1c) goto LAB_0029238b;
            if (_Var4._M_i != 0x3a) goto LAB_0029239e;
            bVar1 = hasRegisteredConverterFunction(fromType,(QMetaType)0x6ad8c8);
LAB_0029239a:
            if (bVar1 != false) goto LAB_0029232e;
          }
LAB_0029239e:
          if ((fromType.d_ptr == (QMetaTypeInterface *)0x0) ||
             (((fromType.d_ptr)->flags & 0x10) == 0)) {
            if (((toType.d_ptr)->flags & 0x10) == 0) {
              if ((_Var4._M_i != 0x33 || fromType.d_ptr == (QMetaTypeInterface *)0x0) ||
                 (((fromType.d_ptr)->flags & 0x800) == 0)) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  bVar2 = canConvertMetaObject(fromType,toType);
                  return bVar2;
                }
                goto LAB_00292458;
              }
              goto LAB_0029232e;
            }
            if ((uVar3 == 10) || (uVar3 == 0xc)) goto LAB_0029232e;
            QMetaType(&local_48,4);
            toType.d_ptr = local_48.d_ptr;
          }
          else {
            if ((_Var4._M_i == 10) || (_Var4._M_i == 0xc)) goto LAB_0029232e;
            QMetaType(&local_40,4);
            fromType.d_ptr = local_40.d_ptr;
          }
          bVar2 = canConvert(fromType,toType);
          goto LAB_0029232e;
        }
        toType.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaAssociation>_>::metaType
        ;
        if (fromType.d_ptr != (QMetaTypeInterface *)0x0) {
          iVar5 = ((fromType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
          if (iVar5 == 0) {
            iVar5 = registerHelper(fromType.d_ptr);
          }
          if ((iVar5 == 8) ||
             (toType.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaAssociation>_>::
                              metaType, iVar5 == 0x1c)) goto LAB_0029232e;
        }
      }
      toType.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaSequence>_>::metaType;
    } while (fromType.d_ptr == (QMetaTypeInterface *)0x0);
    iVar5 = ((fromType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar5 == 0) {
      iVar5 = registerHelper(fromType.d_ptr);
    }
    toType.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaSequence>_>::metaType;
  } while ((0x28 < iVar5 - 9U) ||
          (toType.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaSequence>_>::metaType
          , (0x1000000000fU >> ((ulong)(iVar5 - 9U) & 0x3f) & 1) == 0));
LAB_0029232e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
LAB_00292458:
  __stack_chk_fail();
}

Assistant:

bool QMetaType::canConvert(QMetaType fromType, QMetaType toType)
{
    int fromTypeId = fromType.id();
    int toTypeId = toType.id();

    if (fromTypeId == UnknownType || toTypeId == UnknownType)
        return false;

    if (fromTypeId == toTypeId)
        return true;

    if (auto moduleHelper = qModuleHelperForType(qMax(fromTypeId, toTypeId))) {
        if (moduleHelper->convert(nullptr, fromTypeId, nullptr, toTypeId))
            return true;
    }
    const ConverterFunction * const f =
        customTypesConversionRegistry()->function(std::make_pair(fromTypeId, toTypeId));
    if (f)
        return true;

    if (toTypeId == qMetaTypeId<QSequentialIterable>())
        return canConvertToSequentialIterable(fromType);

    if (toTypeId == qMetaTypeId<QAssociativeIterable>())
        return canConvertToAssociativeIterable(fromType);
    if (toTypeId == QVariantList
            && canConvert(fromType, QMetaType::fromType<QSequentialIterable>())) {
        return true;
    }

    if ((toTypeId == QVariantHash || toTypeId == QVariantMap)
            && canConvert(fromType, QMetaType::fromType<QAssociativeIterable>())) {
        return true;
    }

    if (toTypeId == QVariantPair && hasRegisteredConverterFunction(
                    fromType, QMetaType::fromType<QtMetaTypePrivate::QPairVariantInterfaceImpl>()))
        return true;

    if (fromType.flags() & IsEnumeration) {
        if (toTypeId == QString || toTypeId == QByteArray)
            return true;
        return canConvert(QMetaType(LongLong), toType);
    }
    if (toType.flags() & IsEnumeration) {
        if (fromTypeId == QString || fromTypeId == QByteArray)
            return true;
        return canConvert(fromType, QMetaType(LongLong));
    }
    if (toTypeId == Nullptr && fromType.flags() & IsPointer)
        return true;
    if (canConvertMetaObject(fromType, toType))
        return true;

    return false;
}